

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz_compress_3d.cpp
# Opt level: O0

uchar * sz_compress_3d<float>
                  (float *data,size_t r1,size_t r2,size_t r3,double precision,
                  size_t *compressed_size,int BSIZE,bool block_independant)

{
  size_t state_num;
  long lVar1;
  uchar **compressed_pos_00;
  size_t in_RCX;
  size_t in_RDX;
  size_t in_RSI;
  ulong uVar2;
  long *in_R8;
  int in_R9D;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uchar *unaff_retaddr;
  byte bStack0000000000000008;
  int in_stack_0000000c;
  double in_stack_00000010;
  meanInfo<float> *in_stack_00000018;
  DSize_3d *in_stack_00000020;
  float *in_stack_00000028;
  uchar *compressed_pos;
  size_t est_size;
  uchar *compressed;
  size_t unpredictable_count;
  size_t reg_count;
  float *reg_unpredictable_data_pos;
  float *reg_unpredictable_data;
  int *reg_params_type;
  float *unpredictable_data_pos;
  uchar *indicator;
  float *unpredictable_data;
  int *type;
  int intv_radius;
  meanInfo<float> mean_info;
  int capacity;
  DSize_3d size;
  float *pfVar6;
  uchar **ppuVar7;
  void **reg_unpredictable_data_00;
  void **reg_params_type_00;
  size_t local_118;
  byte local_109;
  uchar **type_00;
  size_t local_e8;
  void *local_e0;
  void *local_d8;
  uchar **local_d0;
  void *local_c8;
  uchar *local_c0;
  void *local_b8;
  float *local_b0;
  int local_a8;
  meanInfo<float> local_a4;
  int local_9c;
  DSize_3d local_98;
  byte local_3d;
  long *local_38;
  double local_30 [5];
  
  local_3d = bStack0000000000000008 & 1;
  local_38 = in_R8;
  DSize_3d::DSize_3d(&local_98,in_RSI,in_RDX,in_RCX,in_R9D);
  local_9c = 0;
  local_a4 = optimize_quant_invl_3d<float>
                       (reg_unpredictable_data_pos,reg_count,unpredictable_count,(size_t)compressed,
                        (double)est_size,(int *)compressed_pos);
  local_a8 = local_9c >> 1;
  local_b0 = (float *)malloc(local_98.num_elements << 2);
  auVar4._8_4_ = (int)(local_98.num_elements >> 0x20);
  auVar4._0_8_ = local_98.num_elements;
  auVar4._12_4_ = 0x45300000;
  dVar3 = ((auVar4._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)local_98.num_elements) - 4503599627370496.0)) * 0.05 *
          4.0;
  uVar2 = (ulong)dVar3;
  local_b8 = malloc(uVar2 | (long)(dVar3 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f);
  local_c0 = (uchar *)malloc(local_98.num_blocks);
  local_c8 = local_b8;
  local_d0 = (uchar **)malloc(local_98.num_blocks << 4);
  local_e0 = malloc(local_98.num_blocks << 4);
  pfVar6 = local_b0;
  ppuVar7 = local_d0;
  local_d8 = local_e0;
  if ((local_3d & 1) == 0) {
    reg_unpredictable_data_00 = &local_e0;
    reg_params_type_00 = &local_c8;
    local_118 = prediction_and_quantization_3d_with_border_prediction<float>
                          (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010,
                           in_stack_0000000c,_bStack0000000000000008,unaff_retaddr,
                           (int *)reg_unpredictable_data,reg_params_type,
                           (float **)unpredictable_data_pos,(float **)indicator);
  }
  else {
    reg_unpredictable_data_00 = &local_e0;
    reg_params_type_00 = &local_c8;
    local_118 = prediction_and_quantization_3d<float>
                          (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010,
                           in_stack_0000000c,_bStack0000000000000008,unaff_retaddr,
                           (int *)reg_unpredictable_data,reg_params_type,
                           (float **)unpredictable_data_pos,(float **)indicator);
  }
  local_e8 = local_118;
  state_num = (long)local_c8 - (long)local_b8 >> 2;
  lVar1 = local_98.num_elements << 2;
  auVar5._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar5._0_8_ = lVar1;
  auVar5._12_4_ = 0x45300000;
  dVar3 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) * 1.2;
  uVar2 = (ulong)dVar3;
  uVar2 = uVar2 | (long)(dVar3 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f;
  compressed_pos_00 = (uchar **)malloc(uVar2);
  type_00 = compressed_pos_00;
  write_variable_to_dst<int>((uchar **)&stack0xfffffffffffffef8,&local_98.block_size);
  write_variable_to_dst<double>((uchar **)&stack0xfffffffffffffef8,local_30);
  local_109 = local_3d & 1;
  write_variable_to_dst<char>((uchar **)&stack0xfffffffffffffef8,(char *)&local_109);
  write_variable_to_dst<int>((uchar **)&stack0xfffffffffffffef8,&local_a8);
  write_variable_to_dst<meanInfo<float>>((uchar **)&stack0xfffffffffffffef8,&local_a4);
  write_variable_to_dst<unsigned_long>((uchar **)&stack0xfffffffffffffef8,&local_e8);
  write_variable_to_dst<unsigned_long>
            ((uchar **)&stack0xfffffffffffffef8,(unsigned_long *)&stack0xffffffffffffff10);
  write_array_to_dst<float>(ppuVar7,pfVar6,0x107541);
  convertIntArray2ByteArray_fast_1b_to_result_sz
            (local_c0,local_98.num_blocks,(uchar **)&stack0xfffffffffffffef8);
  if (local_e8 != 0) {
    encode_regression_coefficients
              ((int *)reg_params_type_00,(float *)reg_unpredictable_data_00,(size_t)ppuVar7,
               (size_t)pfVar6,(uchar **)0x10758a);
  }
  Huffman_encode_tree_and_data(state_num,(int *)type_00,uVar2,compressed_pos_00);
  *local_38 = (long)compressed_pos_00 - (long)type_00;
  free(local_c0);
  free(local_b8);
  free(local_d0);
  free(local_d8);
  free(local_b0);
  return (uchar *)type_00;
}

Assistant:

unsigned char *
sz_compress_3d(const T * data, size_t r1, size_t r2, size_t r3, double precision, size_t& compressed_size, int BSIZE, bool block_independant){
	// block_independant = false;
	DSize_3d size(r1, r2, r3, BSIZE);
	int capacity = 0; // num of quant intervals
	meanInfo<T> mean_info = optimize_quant_invl_3d(data, r1, r2, r3, precision, capacity);
	int intv_radius = (capacity >> 1);
	int * type = (int *) malloc(size.num_elements * sizeof(int));
	T * unpredictable_data = (T *) malloc((0.05*size.num_elements) * sizeof(T));
	unsigned char * indicator = (unsigned char *) malloc(size.num_blocks * sizeof(unsigned char));
	T * unpredictable_data_pos = unpredictable_data;
	int * reg_params_type = (int *) malloc(RegCoeffNum3d * size.num_blocks * sizeof(int));
	float * reg_unpredictable_data = (float *) malloc(RegCoeffNum3d * size.num_blocks * sizeof(float));
	float * reg_unpredictable_data_pos = reg_unpredictable_data;
	size_t reg_count = block_independant? prediction_and_quantization_3d(data, size, mean_info, precision, capacity, intv_radius, indicator, type, reg_params_type, reg_unpredictable_data_pos, unpredictable_data_pos)
			: prediction_and_quantization_3d_with_border_prediction(data, size, mean_info, precision, capacity, intv_radius, indicator, type, reg_params_type, reg_unpredictable_data_pos, unpredictable_data_pos);
	size_t unpredictable_count = unpredictable_data_pos - unpredictable_data;
	unsigned char * compressed = NULL;
	// TODO: change to a better estimated size
	size_t est_size = size.num_elements*sizeof(T)*1.2;
	compressed = (unsigned char *) malloc(est_size);
	unsigned char * compressed_pos = compressed;
	write_variable_to_dst(compressed_pos, size.block_size);
	write_variable_to_dst(compressed_pos, precision);
	write_variable_to_dst(compressed_pos, (char) block_independant);
	write_variable_to_dst(compressed_pos, intv_radius);
	write_variable_to_dst(compressed_pos, mean_info);
	write_variable_to_dst(compressed_pos, reg_count);
	write_variable_to_dst(compressed_pos, unpredictable_count);
	write_array_to_dst(compressed_pos, unpredictable_data, unpredictable_count);
	convertIntArray2ByteArray_fast_1b_to_result_sz(indicator, size.num_blocks, compressed_pos);
	if(reg_count) encode_regression_coefficients(reg_params_type, reg_unpredictable_data, reg_count, reg_unpredictable_data_pos - reg_unpredictable_data, compressed_pos);
	Huffman_encode_tree_and_data(2*capacity, type, size.num_elements, compressed_pos);
	compressed_size = compressed_pos - compressed;
	free(indicator);
	free(unpredictable_data);
	free(reg_params_type);
	free(reg_unpredictable_data);
	free(type);
	return compressed;
}